

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
CLPIStreamInfo::composeStreamCodingInfo(CLPIStreamInfo *this,BitStreamWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint beforeCount;
  uint8_t *lengthPos;
  BitStreamWriter *writer_local;
  CLPIStreamInfo *this_local;
  
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,0);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  bVar1 = isVideoStreamType((this->super_M2TSStreamInfo).stream_coding_type);
  if (bVar1) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).aspect_ratio_index);
    BitStreamWriter::putBits(writer,2,0);
    BitStreamWriter::putBit(writer,0);
    BitStreamWriter::putBit(writer,0);
    if (((this->super_M2TSStreamInfo).HDR & 0x12U) == 0) {
      if ((this->super_M2TSStreamInfo).HDR == 4) {
        BitStreamWriter::putBits(writer,8,0x22);
      }
      else {
        BitStreamWriter::putBits(writer,8,0);
      }
    }
    else {
      BitStreamWriter::putBits(writer,8,0x12);
    }
    if ((this->super_M2TSStreamInfo).HDR == 0x10) {
      BitStreamWriter::putBits(writer,8,0x80);
    }
    else {
      BitStreamWriter::putBits(writer,8,0);
    }
    composeISRC(writer);
    BitStreamWriter::putBits(writer,0x20,0);
  }
  else {
    bVar1 = isAudioStreamType((this->super_M2TSStreamInfo).stream_coding_type);
    if (bVar1) {
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).sampling_frequency_index)
      ;
      writeString((this->super_M2TSStreamInfo).language_code,writer,3);
      composeISRC(writer);
      BitStreamWriter::putBits(writer,0x20,0);
    }
    else if (((this->super_M2TSStreamInfo).stream_coding_type == SUB_PGS) ||
            ((this->super_M2TSStreamInfo).stream_coding_type == SUB_IGS)) {
      writeString((this->super_M2TSStreamInfo).language_code,writer,3);
      BitStreamWriter::putBits(writer,8,0);
      composeISRC(writer);
      BitStreamWriter::putBits(writer,0x20,0);
    }
    else if ((this->super_M2TSStreamInfo).stream_coding_type == SUB_TGS) {
      BitStreamWriter::putBits(writer,8,(uint)(this->super_M2TSStreamInfo).character_code);
      writeString((this->super_M2TSStreamInfo).language_code,writer,3);
      composeISRC(writer);
      BitStreamWriter::putBits(writer,0x20,0);
    }
  }
  iVar4 = BitStreamWriter::getBitsCount(writer);
  puVar5[iVar2 / 8] = (char)(iVar4 / 8) - (char)(iVar3 / 8);
  return;
}

Assistant:

void CLPIStreamInfo::composeStreamCodingInfo(BitStreamWriter& writer) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const unsigned beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));

    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        writer.putBits(4, aspect_ratio_index);
        writer.putBits(2, 0);  // reserved_for_future_use
        writer.putBit(0);      // cc_flag
        writer.putBit(0);      // reserved
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x80);  // HDR10plus
        else
            writer.putBits(8, 0);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        writer.putBits(8, character_code);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - beforeCount);
}